

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O1

logical pnga_update_ghost_dir(Integer g_a,Integer pdim,Integer pdir,logical pflag)

{
  long lVar1;
  short sVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  C_Integer *pCVar7;
  char *pcVar8;
  global_array_t *pgVar9;
  int iVar10;
  Integer proc;
  logical lVar11;
  long lVar12;
  size_t sVar13;
  Integer IVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  C_Integer CVar23;
  long lVar24;
  Integer _last;
  long lVar25;
  long lVar26;
  long lVar27;
  ulong proc_00;
  int _ndim_4;
  ulong uVar28;
  int _ndim;
  int _index [7];
  Integer np;
  Integer _hi [7];
  int stride_rem [7];
  int stride_loc [7];
  Integer thi_rem [7];
  Integer tlo_rem [7];
  Integer width [7];
  int count [7];
  Integer plo_loc [7];
  char err_string [256];
  Integer hi_loc [7];
  Integer lo_loc [7];
  Integer phi_loc [7];
  Integer mask [7];
  Integer ld_rem [7];
  Integer ld_loc [7];
  Integer plo_rem [7];
  Integer dims [7];
  Integer lmask [7];
  int local_5f8;
  int local_5f0;
  int local_5b8 [8];
  ulong *local_598;
  long local_590;
  Integer local_588;
  int local_57c;
  int local_578;
  uint local_574;
  long local_570;
  long local_568;
  long local_560;
  Integer *local_558;
  long local_550;
  Integer local_548;
  logical local_540;
  long local_538 [7];
  size_t local_500;
  long local_4f8;
  long local_4f0;
  long local_4e8;
  ulong local_4e0;
  long local_4d8;
  char **local_4d0;
  int local_4c8 [8];
  int local_4a8 [8];
  Integer local_488 [8];
  Integer local_448 [8];
  long local_408 [8];
  int local_3c8 [8];
  long alStack_3a8 [8];
  long local_368;
  undefined7 uStack_360;
  undefined1 uStack_359;
  undefined7 uStack_358;
  Integer local_268 [8];
  Integer local_228 [8];
  long alStack_1e8 [8];
  Integer aIStack_1a8 [8];
  long local_168 [8];
  long local_128 [7];
  long alStack_f0 [9];
  long local_a8 [8];
  long local_68 [7];
  
  local_540 = pflag;
  proc = pnga_nodeid();
  iVar19 = _ga_sync_end;
  iVar4 = _ga_sync_begin;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  lVar11 = pnga_has_ghosts(g_a);
  if (lVar11 != 0) {
    lVar1 = g_a + 1000;
    iVar10 = GA[lVar1].p_handle;
    if (iVar4 != 0) {
      pnga_pgroup_sync((long)iVar10);
    }
    pgVar9 = GA;
    local_550 = (long)iVar10;
    iVar4 = GA[lVar1].elemsize;
    sVar2 = GA[lVar1].ndim;
    lVar25 = (long)sVar2;
    local_548 = pdir;
    if (0 < lVar25) {
      memcpy(local_408,GA[g_a + 1000].width,lVar25 * 8);
      pdir = local_548;
      memcpy(local_a8,pgVar9[g_a + 1000].dims,lVar25 * 8);
    }
    if (0 < sVar2) {
      lVar17 = 0;
      lVar20 = 0;
      do {
        lVar26 = (long)pgVar9[lVar1].nblock[lVar17];
        local_588 = 0;
        lVar12 = lVar20;
        if (0 < lVar26) {
          lVar12 = lVar20 + lVar26;
          local_588 = 0;
          do {
            if (local_588 < pgVar9[lVar1].nblock[lVar17] + -1) {
              if ((pgVar9[lVar1].mapc[lVar20 + 1] - pgVar9[lVar1].mapc[lVar20]) + 1 <
                  local_408[lVar17]) {
                return 0;
              }
            }
            else if ((pgVar9[lVar1].dims[lVar17] - pgVar9[lVar1].mapc[lVar20]) + 1 <
                     local_408[lVar17]) {
              return 0;
            }
            lVar20 = lVar20 + 1;
            local_588 = local_588 + 1;
          } while (lVar26 != local_588);
        }
        lVar17 = lVar17 + 1;
        lVar20 = lVar12;
      } while (lVar17 != lVar25);
    }
    local_558 = (Integer *)malloc(GAnproc * 0x70 | 8);
    if (local_558 == (Integer *)0x0) {
      pnga_error("pnga_update_ghost_dir:malloc failed (_ga_map)",0);
    }
    local_598 = (ulong *)malloc(GAnproc * 0x70 | 8);
    if (local_598 == (ulong *)0x0) {
      pnga_error("pnga_update_ghost_dir:malloc failed (_ga_proclist)",0);
    }
    pnga_distribution(g_a,proc,local_228,local_268);
    lVar20 = 1;
    local_57c = iVar19;
    if ((local_540 != 0) && (1 < sVar2)) {
      lVar17 = lVar25 + -1;
      do {
        lVar20 = lVar20 * 3;
        lVar17 = lVar17 + -1;
      } while (lVar17 != 0);
    }
    lVar17 = lVar25 + -1;
    local_5f8 = (int)proc;
    local_568 = (long)local_5f8;
    local_578 = sVar2 + -1;
    local_500 = lVar25 * 8 - 8;
    local_570 = g_a * 0x368 + 0xd5068;
    local_560 = g_a * 0x368 + 0xd4f00;
    local_590 = 0;
    local_4e8 = pdim + -1;
    local_4f0 = lVar20 + (ulong)(lVar20 == 0);
    local_4f8 = lVar17;
    do {
      lVar20 = local_4e8;
      if (local_540 == 0) {
        if (1 < sVar2) {
          memset(local_68,0,local_500);
        }
      }
      else if (1 < sVar2) {
        lVar26 = 0;
        lVar12 = local_590;
        do {
          local_68[lVar26] = ~((lVar12 / 3) * 3) + lVar12;
          lVar26 = lVar26 + 1;
          lVar12 = lVar12 / 3;
        } while (lVar17 != lVar26);
      }
      if (0 < sVar2) {
        lVar12 = 0;
        lVar26 = 0;
        do {
          if (lVar20 == lVar12) {
            aIStack_1a8[lVar12] = pdir;
          }
          else {
            aIStack_1a8[lVar12] = local_68[lVar26];
            lVar26 = lVar26 + 1;
          }
          lVar12 = lVar12 + 1;
        } while (lVar25 != lVar12);
      }
      if (0 < sVar2) {
        lVar20 = 0;
        do {
          lVar12 = aIStack_1a8[lVar20];
          if (lVar12 == -1) {
            lVar12 = local_228[lVar20];
            if (1 < lVar12) {
              local_448[lVar20] = lVar12 - local_408[lVar20];
              lVar12 = lVar12 + -1;
              goto LAB_0018525b;
            }
            local_488[lVar20] = local_a8[lVar20];
            local_448[lVar20] = (local_a8[lVar20] - local_408[lVar20]) + 1;
          }
          else {
            if (lVar12 == 1) {
              lVar12 = local_268[lVar20];
              if (lVar12 < local_a8[lVar20]) {
                local_448[lVar20] = lVar12 + 1;
                lVar12 = lVar12 + local_408[lVar20];
              }
              else {
                local_448[lVar20] = 1;
                lVar12 = local_408[lVar20];
              }
            }
            else {
              if (lVar12 != 0) {
                pnga_update_ghost_dir_cold_1();
                goto LAB_00185263;
              }
              local_448[lVar20] = local_228[lVar20];
              lVar12 = local_268[lVar20];
            }
LAB_0018525b:
            local_488[lVar20] = lVar12;
          }
LAB_00185263:
          lVar20 = lVar20 + 1;
        } while (lVar25 != lVar20);
      }
      lVar11 = pnga_locate_region(g_a,local_448,local_488,local_558,(Integer *)local_598,&local_588)
      ;
      if (lVar11 == 0) {
        local_368._0_1_ = 'c';
        local_368._1_1_ = 'a';
        local_368._2_1_ = 'n';
        local_368._3_1_ = 'n';
        local_368._4_1_ = 'o';
        local_368._5_1_ = 't';
        local_368._6_1_ = ' ';
        local_368._7_1_ = 'l';
        uStack_360 = 0x7220657461636f;
        uStack_359 = 0x65;
        uStack_358 = 0x203a6e6f6967;
        strcpy((char *)((long)&uStack_358 + 6),GA[lVar1].name);
        sVar13 = strlen((char *)&local_368);
        sprintf((char *)((long)&local_368 + (long)(int)sVar13)," [%ld:%ld ",local_448[0],
                local_488[0]);
        sVar13 = strlen((char *)&local_368);
        iVar19 = (int)sVar13;
        IVar14 = pnga_ndim(g_a);
        if (1 < IVar14) {
          lVar20 = 1;
          do {
            sprintf((char *)((long)&local_368 + (long)(int)sVar13),",%ld:%ld ",local_448[lVar20],
                    local_488[lVar20]);
            sVar13 = strlen((char *)&local_368);
            iVar19 = (int)sVar13;
            lVar20 = lVar20 + 1;
            IVar14 = pnga_ndim(g_a);
          } while (lVar20 < IVar14);
        }
        *(undefined2 *)((long)&local_368 + (long)iVar19) = 0x5d;
        pnga_error((char *)&local_368,g_a);
        lVar17 = local_4f8;
      }
      if (1 < local_588) {
        pnga_update_ghost_dir_cold_2();
      }
      proc_00 = *local_598;
      pnga_distribution(g_a,proc_00,local_448,local_488);
      pgVar9 = GA;
      if (0 < sVar2) {
        lVar20 = 0;
        do {
          lVar12 = aIStack_1a8[lVar20];
          if (lVar12 == -1) {
            alStack_3a8[lVar20] = 0;
            alStack_1e8[lVar20] = local_408[lVar20] + -1;
            lVar12 = (local_488[lVar20] - local_448[lVar20]) + 1;
LAB_00185498:
            alStack_f0[lVar20 + 1] = lVar12;
          }
          else {
            if (lVar12 == 1) {
              lVar12 = local_408[lVar20];
              alStack_3a8[lVar20] = lVar12 + (local_268[lVar20] - local_228[lVar20]) + 1;
              lVar26 = (local_268[lVar20] - local_228[lVar20]) + lVar12 * 2;
LAB_0018545c:
              alStack_1e8[lVar20] = lVar26;
              goto LAB_00185498;
            }
            if (lVar12 == 0) {
              lVar12 = local_408[lVar20];
              alStack_3a8[lVar20] = lVar12;
              lVar26 = (local_268[lVar20] + lVar12) - local_228[lVar20];
              goto LAB_0018545c;
            }
          }
          lVar20 = lVar20 + 1;
        } while (lVar25 != lVar20);
      }
      uVar3 = GA[lVar1].ndim;
      uVar28 = (ulong)(short)uVar3;
      uVar5 = GA[lVar1].distr_type;
      local_4e0 = (ulong)uVar5;
      local_574 = uVar5 - 1;
      if (uVar5 - 1 < 3) {
        uVar21 = local_568 % GA[lVar1].num_blocks[0];
        local_5b8[0] = (int)uVar21;
        if (1 < (short)uVar3) {
          uVar21 = uVar21 & 0xffffffff;
          lVar20 = 0;
          IVar14 = proc;
          do {
            IVar14 = (long)((int)IVar14 - (int)uVar21) / GA[g_a + 1000].num_blocks[lVar20];
            uVar21 = (long)(int)IVar14 % GA[g_a + 1000].num_blocks[lVar20 + 1];
            local_5b8[lVar20 + 1] = (int)uVar21;
            lVar20 = lVar20 + 1;
          } while ((uVar28 & 0xffffffff) - 1 != lVar20);
        }
        if (0 < (short)uVar3) {
          lVar20 = 0;
          do {
            iVar19 = *(int *)((long)local_5b8 + lVar20);
            lVar12 = *(long *)((long)GA->dims + lVar20 * 2 + local_570 + -0x30);
            *(long *)((long)&local_368 + lVar20 * 2) = lVar12 * iVar19 + 1;
            lVar12 = ((long)iVar19 + 1) * lVar12;
            *(long *)((long)local_538 + lVar20 * 2) = lVar12;
            lVar26 = *(long *)((long)GA + lVar20 * 2 + local_570 + -0x1f8);
            if (lVar26 <= lVar12) {
              lVar12 = lVar26;
            }
            *(long *)((long)local_538 + lVar20 * 2) = lVar12;
            lVar20 = lVar20 + 4;
          } while ((uVar28 & 0xffffffff) << 2 != lVar20);
        }
      }
      else if (uVar5 == 4) {
        uVar21 = local_568 % GA[lVar1].num_blocks[0];
        local_5b8[0] = (int)uVar21;
        if (1 < (short)uVar3) {
          uVar21 = uVar21 & 0xffffffff;
          lVar20 = 0;
          IVar14 = proc;
          do {
            IVar14 = (long)((int)IVar14 - (int)uVar21) / GA[g_a + 1000].num_blocks[lVar20];
            uVar21 = (long)(int)IVar14 % GA[g_a + 1000].num_blocks[lVar20 + 1];
            local_5b8[lVar20 + 1] = (int)uVar21;
            lVar20 = lVar20 + 1;
          } while ((uVar28 & 0xffffffff) - 1 != lVar20);
        }
        if (0 < (short)uVar3) {
          pCVar7 = GA[lVar1].mapc;
          lVar20 = 0;
          iVar19 = 0;
          do {
            iVar10 = *(int *)((long)local_5b8 + lVar20);
            lVar12 = (long)iVar19 + (long)iVar10;
            *(C_Integer *)((long)&local_368 + lVar20 * 2) = pCVar7[lVar12];
            if ((long)iVar10 < *(long *)((long)GA[lVar1].num_blocks + lVar20 * 2) + -1) {
              lVar12 = GA[lVar1].mapc[lVar12 + 1] + -1;
            }
            else {
              lVar12 = *(long *)((long)GA[lVar1].dims + lVar20 * 2);
            }
            *(long *)((long)local_538 + lVar20 * 2) = lVar12;
            iVar19 = iVar19 + *(int *)((long)GA[lVar1].num_blocks + lVar20 * 2);
            lVar20 = lVar20 + 4;
          } while ((uVar28 & 0xffffffff) << 2 != lVar20);
        }
      }
      else if (uVar5 == 0) {
        if (GA[lVar1].num_rstrctd == 0) {
          if ((short)uVar3 < 1) {
            lVar20 = 1;
          }
          else {
            lVar20 = 1;
            uVar21 = 0;
            do {
              lVar20 = lVar20 * GA[g_a + 1000].nblock[uVar21];
              uVar21 = uVar21 + 1;
            } while (uVar28 != uVar21);
          }
          if ((-1 < proc) && (proc < lVar20)) {
            if (0 < (short)uVar3) {
              pCVar7 = GA[lVar1].mapc;
              uVar21 = 0;
              lVar20 = 0;
              IVar14 = proc;
              do {
                lVar26 = (long)GA[g_a + 1000].nblock[uVar21];
                lVar12 = IVar14 % lVar26;
                (&local_368)[uVar21] = pCVar7[lVar12 + lVar20];
                if (lVar12 == lVar26 + -1) {
                  CVar23 = GA[g_a + 1000].dims[uVar21];
                }
                else {
                  CVar23 = pCVar7[lVar12 + lVar20 + 1] + -1;
                }
                lVar20 = lVar20 + lVar26;
                local_538[uVar21] = CVar23;
                uVar21 = uVar21 + 1;
                IVar14 = IVar14 / lVar26;
              } while (uVar28 != uVar21);
            }
            goto LAB_00185871;
          }
        }
        else if (proc < GA[lVar1].num_rstrctd) {
          if ((short)uVar3 < 1) {
            lVar20 = 1;
          }
          else {
            lVar20 = 1;
            uVar21 = 0;
            do {
              lVar20 = lVar20 * GA[g_a + 1000].nblock[uVar21];
              uVar21 = uVar21 + 1;
            } while (uVar28 != uVar21);
          }
          if ((-1 < proc) && (proc < lVar20)) {
            if (0 < (short)uVar3) {
              pCVar7 = GA[lVar1].mapc;
              lVar20 = 0;
              uVar21 = 0;
              IVar14 = proc;
              do {
                lVar26 = (long)GA[g_a + 1000].nblock[uVar21];
                lVar12 = IVar14 % lVar26;
                (&local_368)[uVar21] = pCVar7[lVar12 + lVar20];
                if (lVar12 == lVar26 + -1) {
                  CVar23 = GA[g_a + 1000].dims[uVar21];
                }
                else {
                  CVar23 = pCVar7[lVar12 + lVar20 + 1] + -1;
                }
                lVar20 = lVar20 + lVar26;
                local_538[uVar21] = CVar23;
                uVar21 = uVar21 + 1;
                IVar14 = IVar14 / lVar26;
              } while (uVar28 != uVar21);
            }
            goto LAB_00185871;
          }
        }
        if (0 < (short)uVar3) {
          memset(&local_368,0,uVar28 * 8);
          memset(local_538,0xff,uVar28 * 8);
        }
      }
LAB_00185871:
      if (uVar28 == 1) {
        local_128[0] = (local_538[0] - local_368) + pgVar9[lVar1].width[0] * 2 + 1;
      }
      if ((short)uVar3 < 2) {
        lVar12 = 1;
        lVar20 = 0;
      }
      else {
        lVar12 = 1;
        lVar26 = 0;
        lVar20 = 0;
        do {
          lVar20 = lVar20 + alStack_3a8[lVar26] * lVar12;
          lVar27 = (local_538[lVar26] - (&local_368)[lVar26]) +
                   *(long *)((long)pgVar9->dims + lVar26 * 8 + local_560 + -0x30) * 2 + 1;
          local_128[lVar26] = lVar27;
          lVar12 = lVar12 * lVar27;
          lVar26 = lVar26 + 1;
        } while (uVar28 - 1 != lVar26);
      }
      lVar26 = alStack_3a8[uVar28 - 1];
      iVar19 = pgVar9[lVar1].elemsize;
      pcVar6 = pgVar9[lVar1].ptr[proc];
      local_4d0 = pgVar9[lVar1].ptr;
      local_4d8 = (long)iVar19;
      local_5f0 = (int)proc_00;
      if (local_574 < 3) {
        uVar21 = (long)local_5f0 % pgVar9[lVar1].num_blocks[0];
        local_5b8[0] = (int)uVar21;
        if (1 < (short)uVar3) {
          uVar21 = uVar21 & 0xffffffff;
          lVar27 = 0;
          uVar15 = proc_00;
          do {
            uVar15 = (long)((int)uVar15 - (int)uVar21) / pgVar9[g_a + 1000].num_blocks[lVar27];
            uVar21 = (long)(int)uVar15 % pgVar9[g_a + 1000].num_blocks[lVar27 + 1];
            local_5b8[lVar27 + 1] = (int)uVar21;
            lVar27 = lVar27 + 1;
          } while ((uVar28 & 0xffffffff) - 1 != lVar27);
        }
        if (0 < (short)uVar3) {
          lVar27 = 0;
          do {
            iVar10 = *(int *)((long)local_5b8 + lVar27);
            lVar22 = *(long *)((long)pgVar9->dims + lVar27 * 2 + local_570 + -0x30);
            *(long *)((long)&local_368 + lVar27 * 2) = lVar22 * iVar10 + 1;
            lVar22 = ((long)iVar10 + 1) * lVar22;
            *(long *)((long)local_538 + lVar27 * 2) = lVar22;
            lVar18 = *(long *)((long)pgVar9 + lVar27 * 2 + local_570 + -0x1f8);
            if (lVar18 <= lVar22) {
              lVar22 = lVar18;
            }
            *(long *)((long)local_538 + lVar27 * 2) = lVar22;
            lVar27 = lVar27 + 4;
          } while ((uVar28 & 0xffffffff) << 2 != lVar27);
        }
      }
      else if ((int)local_4e0 == 4) {
        uVar21 = (long)local_5f0 % pgVar9[lVar1].num_blocks[0];
        local_5b8[0] = (int)uVar21;
        if (1 < (short)uVar3) {
          uVar21 = uVar21 & 0xffffffff;
          lVar27 = 0;
          uVar15 = proc_00;
          do {
            uVar15 = (long)((int)uVar15 - (int)uVar21) / pgVar9[g_a + 1000].num_blocks[lVar27];
            uVar21 = (long)(int)uVar15 % pgVar9[g_a + 1000].num_blocks[lVar27 + 1];
            local_5b8[lVar27 + 1] = (int)uVar21;
            lVar27 = lVar27 + 1;
          } while ((uVar28 & 0xffffffff) - 1 != lVar27);
        }
        if (0 < (short)uVar3) {
          pCVar7 = pgVar9[lVar1].mapc;
          lVar27 = 0;
          iVar10 = 0;
          do {
            iVar16 = *(int *)((long)local_5b8 + lVar27);
            lVar22 = (long)iVar10 + (long)iVar16;
            *(C_Integer *)((long)&local_368 + lVar27 * 2) = pCVar7[lVar22];
            if ((long)iVar16 < *(long *)((long)pgVar9[lVar1].num_blocks + lVar27 * 2) + -1) {
              lVar22 = pgVar9[lVar1].mapc[lVar22 + 1] + -1;
            }
            else {
              lVar22 = *(long *)((long)pgVar9[lVar1].dims + lVar27 * 2);
            }
            *(long *)((long)local_538 + lVar27 * 2) = lVar22;
            iVar10 = iVar10 + *(int *)((long)pgVar9[lVar1].num_blocks + lVar27 * 2);
            lVar27 = lVar27 + 4;
          } while ((uVar28 & 0xffffffff) << 2 != lVar27);
        }
      }
      else if ((int)local_4e0 == 0) {
        if (pgVar9[lVar1].num_rstrctd == 0) {
          if ((short)uVar3 < 1) {
            lVar27 = 1;
          }
          else {
            lVar27 = 1;
            uVar21 = 0;
            do {
              lVar27 = lVar27 * pgVar9[g_a + 1000].nblock[uVar21];
              uVar21 = uVar21 + 1;
            } while (uVar28 != uVar21);
          }
          if (((long)proc_00 < 0) || (lVar27 <= (long)proc_00)) {
LAB_00185cc5:
            if (0 < (short)uVar3) {
              memset(&local_368,0,uVar28 << 3);
LAB_00185cf4:
              memset(local_538,0xff,uVar28 << 3);
            }
          }
          else if (0 < (short)uVar3) {
            pCVar7 = pgVar9[lVar1].mapc;
            lVar27 = 0;
            uVar15 = 0;
            uVar21 = proc_00;
            do {
              lVar18 = (long)pgVar9[g_a + 1000].nblock[uVar15];
              lVar22 = (long)uVar21 % lVar18;
              (&local_368)[uVar15] = pCVar7[lVar22 + lVar27];
              if (lVar22 == lVar18 + -1) {
                CVar23 = pgVar9[g_a + 1000].dims[uVar15];
              }
              else {
                CVar23 = pCVar7[lVar22 + lVar27 + 1] + -1;
              }
              lVar27 = lVar27 + lVar18;
              local_538[uVar15] = CVar23;
              uVar15 = uVar15 + 1;
              uVar21 = (long)uVar21 / lVar18;
            } while (uVar28 != uVar15);
          }
        }
        else if ((long)proc_00 < pgVar9[lVar1].num_rstrctd) {
          if ((short)uVar3 < 1) {
            lVar27 = 1;
          }
          else {
            lVar27 = 1;
            uVar21 = 0;
            do {
              lVar27 = lVar27 * pgVar9[g_a + 1000].nblock[uVar21];
              uVar21 = uVar21 + 1;
            } while (uVar28 != uVar21);
          }
          if (((long)proc_00 < 0) || (lVar27 <= (long)proc_00)) goto LAB_00185cc5;
          if (0 < (short)uVar3) {
            pCVar7 = pgVar9[lVar1].mapc;
            lVar27 = 0;
            uVar15 = 0;
            uVar21 = proc_00;
            do {
              lVar18 = (long)pgVar9[g_a + 1000].nblock[uVar15];
              lVar22 = (long)uVar21 % lVar18;
              (&local_368)[uVar15] = pCVar7[lVar22 + lVar27];
              if (lVar22 == lVar18 + -1) {
                CVar23 = pgVar9[g_a + 1000].dims[uVar15];
              }
              else {
                CVar23 = pCVar7[lVar22 + lVar27 + 1] + -1;
              }
              lVar27 = lVar27 + lVar18;
              local_538[uVar15] = CVar23;
              uVar15 = uVar15 + 1;
              uVar21 = (long)uVar21 / lVar18;
            } while (uVar28 != uVar15);
          }
        }
        else if (0 < (short)uVar3) {
          memset(&local_368,0,(ulong)uVar3 << 3);
          goto LAB_00185cf4;
        }
      }
      pdir = local_548;
      if (uVar28 == 1) {
        local_168[0] = (local_538[0] - local_368) + pgVar9[lVar1].width[0] * 2 + 1;
      }
      if ((short)uVar3 < 2) {
        lVar22 = 1;
        lVar27 = 0;
      }
      else {
        lVar22 = 1;
        lVar27 = 0;
        lVar18 = 0;
        do {
          lVar27 = lVar27 + alStack_f0[lVar18 + 1] * lVar22;
          lVar24 = (local_538[lVar18] - (&local_368)[lVar18]) +
                   *(long *)((long)pgVar9->dims + lVar18 * 8 + local_560 + -0x30) * 2 + 1;
          local_168[lVar18] = lVar24;
          lVar22 = lVar22 * lVar24;
          lVar18 = lVar18 + 1;
        } while (uVar28 - 1 != lVar18);
      }
      lVar18 = alStack_f0[uVar28];
      pcVar8 = local_4d0[proc_00];
      local_4a8[0] = iVar4;
      local_4c8[0] = iVar4;
      if (1 < sVar2) {
        lVar24 = 0;
        iVar10 = iVar4;
        iVar16 = iVar4;
        do {
          iVar16 = iVar16 * (int)local_168[lVar24];
          local_4c8[lVar24] = iVar16;
          iVar10 = iVar10 * (int)local_128[lVar24];
          local_4a8[lVar24] = iVar10;
          local_4c8[lVar24 + 1] = iVar16;
          local_4a8[lVar24 + 1] = iVar10;
          lVar24 = lVar24 + 1;
        } while (lVar17 != lVar24);
      }
      if (0 < sVar2) {
        lVar24 = 0;
        do {
          local_3c8[lVar24] = ((int)alStack_1e8[lVar24] - (int)alStack_3a8[lVar24]) + 1;
          lVar24 = lVar24 + 1;
        } while (lVar25 != lVar24);
      }
      local_3c8[0] = local_3c8[0] * iVar4;
      if (-1 < (int)local_550) {
        proc_00 = (ulong)(uint)PGRP_LIST[local_550].inv_map_proc_list[proc_00];
      }
      ARMCI_GetS(pcVar8 + (lVar22 * lVar18 + lVar27) * local_4d8,local_4c8,
                 pcVar6 + (lVar12 * lVar26 + lVar20) * (long)iVar19,local_4a8,local_3c8,local_578,
                 (int)proc_00);
      local_590 = local_590 + 1;
    } while (local_590 != local_4f0);
    if (local_57c != 0) {
      pnga_pgroup_sync(local_550);
    }
    free(local_558);
    free(local_598);
  }
  return 1;
}

Assistant:

logical pnga_update_ghost_dir(Integer g_a,    /* GA handle */
                                   Integer pdim,   /* Dimension of update */
                                   Integer pdir,   /* Direction of update (+/-1) */
                                   logical pflag)  /* include corner cells */
{
  Integer idx, ipx, inx, np, handle=GA_OFFSET + g_a, proc_rem;
  Integer ntot, mask[MAXDIM],lmask[MAXDIM];
  Integer size, ndim, i, itmp, idim, idir;
  Integer width[MAXDIM], dims[MAXDIM];
  Integer lo_loc[MAXDIM], hi_loc[MAXDIM];
  Integer plo_loc[MAXDIM], phi_loc[MAXDIM];
  Integer tlo_rem[MAXDIM], thi_rem[MAXDIM];
  Integer plo_rem[MAXDIM]/*, phi_rem[MAXDIM]*/;
  Integer ld_loc[MAXDIM], ld_rem[MAXDIM];
  logical flag;
  int stride_loc[MAXDIM], stride_rem[MAXDIM],count[MAXDIM];
  char *ptr_loc, *ptr_rem;
  Integer me = pnga_nodeid();
  Integer p_handle;
  Integer *_ga_map = NULL;
  Integer *_ga_proclist = NULL;
  int local_sync_begin,local_sync_end;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/

  /* if global array has no ghost cells, just return */
  if (!pnga_has_ghosts(g_a)) 
    return TRUE;
  
  p_handle = GA[handle].p_handle;
  if(local_sync_begin)pnga_pgroup_sync(p_handle);
  idim = pdim;
  idir = pdir;
  flag = pflag;

  size = GA[handle].elemsize;
  ndim = GA[handle].ndim;
  /* initialize ghost cell widths and get array dimensions */
  for (idx=0; idx < ndim; idx++) {
    width[idx] = (Integer)GA[handle].width[idx];
    dims[idx] = (Integer)GA[handle].dims[idx];
  }

  /* Check to make sure that global array is well-behaved (all processors
     have data and the width of the data in each dimension is greater than
     the corresponding value in width[]). */
  ipx = 0;
  for (idx = 0; idx < ndim; idx++) {
    for (np = 0; np < GA[handle].nblock[idx]; np++) {
      if (np < GA[handle].nblock[idx] - 1) {
        if (GA[handle].mapc[ipx+1]-GA[handle].mapc[ipx]+1<width[idx]) {
          return FALSE;
        }
      } else {
        if (GA[handle].dims[idx]-GA[handle].mapc[ipx]+1<width[idx]) {
          return FALSE;
        }
      }
      ipx++;
    }
  }

  _ga_map = malloc((GAnproc*2*MAXDIM+1)*sizeof(Integer));
  if(!_ga_map) pnga_error("pnga_update_ghost_dir:malloc failed (_ga_map)",0);
  _ga_proclist = malloc((GAnproc*2*MAXDIM+1)*sizeof(Integer));
  if(!_ga_proclist) pnga_error("pnga_update_ghost_dir:malloc failed (_ga_proclist)",0);

  /* Get pointer to local memory */
  ptr_loc = GA[handle].ptr[GAme];
  /* obtain range of data that is held by local processor */
  pnga_distribution(g_a,me,lo_loc,hi_loc);

  /* evaluate total number of GET operations */
  ntot = 1;
  if (flag) {
    for (idx=0; idx < ndim-1; idx++) ntot *= 3;
  }

  /* Loop over all GET operations. */
  for (ipx=0; ipx < ntot; ipx++) {
    /* Convert ipx to corresponding mask values */
    if (flag) {
      itmp = ipx;
      for (idx = 0; idx < ndim-1; idx++) {
        i = itmp%3;
        lmask[idx] = i-1;
        itmp = (itmp-i)/3;
      }
    } else {
      for (idx = 0; idx < ndim-1; idx++) lmask[idx] = 0;
    }
    inx = 0;
    for (idx = 0; idx < ndim; idx++) {
      if (idx == idim-1) {
        mask[idx] = idir;
      } else {
        mask[idx] = lmask[inx];
        inx++;
      }
    }
    /* Now that mask has been determined, find processor that contains
     * data needed by the corresponding block of ghost cells */
    for (idx = 0; idx < ndim; idx++) {
      if (mask[idx] == 0) {
        tlo_rem[idx] = lo_loc[idx];
        thi_rem[idx] = hi_loc[idx];
      } else if (mask[idx] == -1) {
        if (lo_loc[idx] > 1) {
          tlo_rem[idx] = lo_loc[idx]-width[idx];
          thi_rem[idx] = lo_loc[idx]-1;
        } else {
          tlo_rem[idx] = dims[idx]-width[idx]+1;
          thi_rem[idx] = dims[idx];
        }
      } else if (mask[idx] == 1) {
        if (hi_loc[idx] < dims[idx]) {
          tlo_rem[idx] = hi_loc[idx] + 1;
          thi_rem[idx] = hi_loc[idx] + width[idx];
        } else {
          tlo_rem[idx] = 1;
          thi_rem[idx] = width[idx];
        }
      } else {
        fprintf(stderr,"Illegal mask value found\n");
      }
    }
    /* Locate remote processor to which data must be sent */
    if (!pnga_locate_region(g_a, tlo_rem, thi_rem, _ga_map,
       _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
       tlo_rem, thi_rem, g_a);
    if (np > 1) {
      fprintf(stderr,"More than one remote processor found\n");
    }
    /* Remote processor has been identified, now get ready to get
       data from it. Start by getting distribution on remote
       processor.*/
    proc_rem = _ga_proclist[0];
    pnga_distribution(g_a, proc_rem, tlo_rem, thi_rem);
    for (idx = 0; idx < ndim; idx++) {
      if (mask[idx] == 0) {
        plo_loc[idx] = width[idx];
        phi_loc[idx] = hi_loc[idx]-lo_loc[idx]+width[idx];
        plo_rem[idx] = plo_loc[idx];
        /*phi_rem[idx] = phi_loc[idx];*/
      } else if (mask[idx] == -1) {
        plo_loc[idx] = 0;
        phi_loc[idx] = width[idx]-1;
        plo_rem[idx] = thi_rem[idx]-tlo_rem[idx]+1;
        /*phi_rem[idx] = thi_rem[idx]-tlo_rem[idx]+width[idx];*/
      } else if (mask[idx] == 1) {
        plo_loc[idx] = hi_loc[idx]-lo_loc[idx]+width[idx]+1;
        phi_loc[idx] = hi_loc[idx]-lo_loc[idx]+2*width[idx];
        plo_rem[idx] = width[idx];
        /*phi_rem[idx] = 2*width[idx]-1;*/
      }
    }
    /* Get pointer to local data buffer and remote data
       buffer as well as lists of leading dimenstions */
    gam_LocationWithGhosts(me, handle, plo_loc, &ptr_loc, ld_loc);
    gam_LocationWithGhosts(proc_rem, handle, plo_rem, &ptr_rem, ld_rem);

    /* Evaluate strides on local and remote processors */
    gam_setstride(ndim, size, ld_loc, ld_rem, stride_rem,
                  stride_loc);

    /* Compute the number of elements in each dimension and store
       result in count. Scale the first element in count by the
       element size. */
    gam_ComputeCount(ndim, plo_loc, phi_loc, count);
    count[0] *= size;
 
    /* get data from remote processor */
    if (p_handle >= 0) {
      proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[proc_rem];
    }
    ARMCI_GetS(ptr_rem, stride_rem, ptr_loc, stride_loc, count,
          (int)(ndim - 1), (int)proc_rem);
  }

  if(local_sync_end)pnga_pgroup_sync(p_handle);
  free(_ga_map);
  free(_ga_proclist);
  return TRUE;
}